

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConvolutionLayerParams::MergeFrom
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  WeightParams *pWVar4;
  ValidPadding *this_00;
  SamePadding *this_01;
  WeightParams *pWVar5;
  ValidPadding *from_00;
  SamePadding *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x6e09);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->kernelsize_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->kernelsize_,iVar1 + (this->kernelsize_).current_size_);
    memcpy(((this->kernelsize_).rep_)->elements + (this->kernelsize_).current_size_,
           ((from->kernelsize_).rep_)->elements,(long)(from->kernelsize_).current_size_ << 3);
    (this->kernelsize_).current_size_ =
         (this->kernelsize_).current_size_ + (from->kernelsize_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->stride_,iVar1 + (this->stride_).current_size_);
    memcpy(((this->stride_).rep_)->elements + (this->stride_).current_size_,
           ((from->stride_).rep_)->elements,(long)(from->stride_).current_size_ << 3);
    (this->stride_).current_size_ = (this->stride_).current_size_ + (from->stride_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->dilationfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->dilationfactor_,iVar1 + (this->dilationfactor_).current_size_);
    memcpy(((this->dilationfactor_).rep_)->elements + (this->dilationfactor_).current_size_,
           ((from->dilationfactor_).rep_)->elements,(long)(from->dilationfactor_).current_size_ << 3
          );
    (this->dilationfactor_).current_size_ =
         (this->dilationfactor_).current_size_ + (from->dilationfactor_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->outputshape_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->outputshape_,iVar1 + (this->outputshape_).current_size_);
    memcpy(((this->outputshape_).rep_)->elements + (this->outputshape_).current_size_,
           ((from->outputshape_).rep_)->elements,(long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ =
         (this->outputshape_).current_size_ + (from->outputshape_).current_size_;
  }
  pWVar5 = from->weights_;
  if (pWVar5 != (WeightParams *)0x0 &&
      from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar4 = this->weights_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar4);
      this->weights_ = pWVar4;
      pWVar5 = from->weights_;
    }
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar4,pWVar5);
  }
  pWVar5 = from->bias_;
  if (pWVar5 != (WeightParams *)0x0 &&
      from != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar4 = this->bias_;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar4 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar4);
      this->bias_ = pWVar4;
      pWVar5 = from->bias_;
    }
    if (pWVar5 == (WeightParams *)0x0) {
      pWVar5 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar4,pWVar5);
  }
  if (from->outputchannels_ != 0) {
    this->outputchannels_ = from->outputchannels_;
  }
  if (from->kernelchannels_ != 0) {
    this->kernelchannels_ = from->kernelchannels_;
  }
  if (from->ngroups_ != 0) {
    this->ngroups_ = from->ngroups_;
  }
  if (from->isdeconvolution_ == true) {
    this->isdeconvolution_ = true;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  if (from->_oneof_case_[0] != 0x33) {
    if (from->_oneof_case_[0] != 0x32) {
      return;
    }
    if (this->_oneof_case_[0] == 0x32) {
      this_00 = (this->ConvolutionPaddingType_).valid_;
    }
    else {
      clear_ConvolutionPaddingType(this);
      this->_oneof_case_[0] = 0x32;
      this_00 = (ValidPadding *)operator_new(0x20);
      ValidPadding::ValidPadding(this_00);
      (this->ConvolutionPaddingType_).valid_ = this_00;
      if (from->_oneof_case_[0] != 0x32) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (ValidPadding *)&_ValidPadding_default_instance_;
        goto LAB_00463ed6;
      }
    }
    from_00 = (from->ConvolutionPaddingType_).valid_;
LAB_00463ed6:
    ValidPadding::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0x33) {
    this_01 = (this->ConvolutionPaddingType_).same_;
  }
  else {
    clear_ConvolutionPaddingType(this);
    this->_oneof_case_[0] = 0x33;
    this_01 = (SamePadding *)operator_new(0x18);
    SamePadding::SamePadding(this_01);
    (this->ConvolutionPaddingType_).same_ = this_01;
    if (from->_oneof_case_[0] != 0x33) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SamePadding *)&_SamePadding_default_instance_;
      goto LAB_00463eec;
    }
  }
  from_01 = (from->ConvolutionPaddingType_).same_;
LAB_00463eec:
  SamePadding::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void ConvolutionLayerParams::MergeFrom(const ConvolutionLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ConvolutionLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  kernelsize_.MergeFrom(from.kernelsize_);
  stride_.MergeFrom(from.stride_);
  dilationfactor_.MergeFrom(from.dilationfactor_);
  outputshape_.MergeFrom(from.outputshape_);
  if (from.has_weights()) {
    mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from.weights());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.outputchannels() != 0) {
    set_outputchannels(from.outputchannels());
  }
  if (from.kernelchannels() != 0) {
    set_kernelchannels(from.kernelchannels());
  }
  if (from.ngroups() != 0) {
    set_ngroups(from.ngroups());
  }
  if (from.isdeconvolution() != 0) {
    set_isdeconvolution(from.isdeconvolution());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
}